

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O2

long fd_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  __off_t _Var1;
  int __whence;
  long lVar2;
  int iVar3;
  int *out;
  
  lVar2 = 1;
  switch(cmd) {
  case 1:
    num = 0;
LAB_0023f6ed:
    if (b->init != 0) {
      iVar3 = b->num;
      __whence = 0;
LAB_0023f6fd:
      _Var1 = lseek(iVar3,num,__whence);
      return _Var1;
    }
    break;
  case 2:
  case 4:
  case 5:
  case 6:
  case 7:
  case 10:
    break;
  case 3:
switchD_0023f6b7_caseD_3:
    if (b->init != 0) {
      iVar3 = b->num;
      __whence = 1;
      num = 0;
      goto LAB_0023f6fd;
    }
    break;
  case 8:
    return (long)b->shutdown;
  case 9:
    b->shutdown = (int)num;
    return 1;
  case 0xb:
    goto switchD_0023f6b7_caseD_b;
  default:
    if (cmd == 0x68) {
      fd_free(b);
      b->num = *ptr;
      b->shutdown = (int)num;
      b->init = 1;
      return 1;
    }
    if (cmd == 0x69) {
      if (b->init == 0) {
        return -1;
      }
      iVar3 = b->num;
      if (ptr == (void *)0x0) {
        return (long)iVar3;
      }
      *(int *)ptr = iVar3;
      return (long)iVar3;
    }
    if (cmd == 0x80) goto LAB_0023f6ed;
    if (cmd == 0x85) goto switchD_0023f6b7_caseD_3;
  }
  lVar2 = 0;
switchD_0023f6b7_caseD_b:
  return lVar2;
}

Assistant:

static long fd_ctrl(BIO *b, int cmd, long num, void *ptr) {
  switch (cmd) {
    case BIO_CTRL_RESET:
      num = 0;
      [[fallthrough]];
    case BIO_C_FILE_SEEK:
      if (b->init) {
        return (long)BORINGSSL_LSEEK(b->num, num, SEEK_SET);
      }
      return 0;
    case BIO_C_FILE_TELL:
    case BIO_CTRL_INFO:
      if (b->init) {
        return (long)BORINGSSL_LSEEK(b->num, 0, SEEK_CUR);
      }
      return 0;
    case BIO_C_SET_FD:
      fd_free(b);
      b->num = *static_cast<int *>(ptr);
      b->shutdown = static_cast<int>(num);
      b->init = 1;
      return 1;
    case BIO_C_GET_FD:
      if (b->init) {
        int *out = static_cast<int *>(ptr);
        if (out != nullptr) {
          *out = b->num;
        }
        return b->num;
      } else {
        return -1;
      }
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}